

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O1

idx_t duckdb::GetFileUrlOffset(string *path)

{
  pointer pcVar1;
  int iVar2;
  idx_t iVar3;
  bool bVar4;
  undefined1 *local_60;
  ulong local_58;
  undefined1 local_50 [16];
  undefined1 *local_40;
  ulong local_38;
  undefined1 local_30 [16];
  
  pcVar1 = (path->_M_dataplus)._M_p;
  local_60 = local_50;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + path->_M_string_length);
  local_40 = local_30;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"file:/","");
  if (local_58 < local_38) {
    bVar4 = false;
  }
  else if (local_38 == 0) {
    bVar4 = true;
  }
  else {
    iVar2 = bcmp(local_40,local_60,local_38);
    bVar4 = iVar2 == 0;
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  if (bVar4) {
    pcVar1 = (path->_M_dataplus)._M_p;
    iVar3 = 5;
    if ((pcVar1[6] == '/') && (iVar3 = 7, pcVar1[7] != '/')) {
      iVar2 = ::std::__cxx11::string::compare((ulong)path,7,(char *)0xa);
      iVar3 = (ulong)(iVar2 == 0) << 4;
    }
  }
  else {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static idx_t GetFileUrlOffset(const string &path) {
	if (!StringUtil::StartsWith(path, "file:/")) {
		return 0;
	}

	// Url without host: file:/some/path
	if (path[6] != '/') {
#ifdef _WIN32
		return 6;
#else
		return 5;
#endif
	}

	// Url with empty host: file:///some/path
	if (path[7] == '/') {
#ifdef _WIN32
		return 8;
#else
		return 7;
#endif
	}

	// Url with localhost: file://localhost/some/path
	if (path.compare(7, 10, "localhost/") == 0) {
#ifdef _WIN32
		return 17;
#else
		return 16;
#endif
	}

	// unkown file:/ url format
	return 0;
}